

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O2

void testwin4(void)

{
  Am_Drawonable *pAVar1;
  Am_Style aAStack_28 [8];
  
  pAVar1 = root;
  Am_Style::Am_Style(aAStack_28,(Am_Style *)&blue);
  d4 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,900,0xa0,200,200,"D4","D4 Icon",1,0,aAStack_28,0,100,100,300,300,1,0,0,1,0)
  ;
  Am_Style::~Am_Style(aAStack_28);
  (**(code **)(*(long *)d4 + 0xa0))();
  change_pos_dim(d4);
  return;
}

Assistant:

void
testwin4()
{
  //printf("Hit RETURN to bring up blue window:");
  //getchar();

  d4 = root->Create(TESTWINSIZES_D4_LEFT, 160, 200, 200, "D4", "D4 Icon", true,
                    false, blue, false,
                    // Min width and height
                    100, 100,
                    // Max width and height
                    300, 300);
  d4->Flush_Output();

  print_win_info(d4, "D4");

  //  change_min_max(d4);
  change_pos_dim(d4);
}